

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberparsing.h
# Opt level: O0

bool parse_large_integer(uint8_t *buf,ParsedJson *pj,uint32_t offset,bool found_minus)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  byte in_CL;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int64_t signed_answer;
  uchar digit;
  uint64_t i;
  bool negative;
  char *p;
  ulong local_80;
  uint64_t local_68;
  byte local_59;
  byte *local_58;
  byte local_4d;
  long local_48;
  bool local_31;
  
  local_4d = in_CL & 1;
  local_58 = (byte *)(in_RDI + (ulong)in_EDX);
  local_59 = local_4d != 0;
  if ((bool)local_59) {
    local_58 = local_58 + 1;
  }
  local_48 = in_RSI;
  if (*local_58 == 0x30) {
    local_58 = local_58 + 1;
    local_68 = 0;
LAB_0011e94b:
    if ((local_59 & 1) == 0) {
      if (0x7fffffffffffffff < local_68) {
        return false;
      }
    }
    else if (0x8000000000000000 < local_68) {
      return false;
    }
    if ((local_59 & 1) == 0) {
      local_80 = local_68;
    }
    else {
      local_80 = -local_68;
    }
    uVar2 = *(uint *)(local_48 + 0x20);
    *(uint *)(local_48 + 0x20) = uVar2 + 1;
    *(undefined8 *)(*(long *)(local_48 + 0x30) + (ulong)uVar2 * 8) = 0x6c00000000000000;
    uVar2 = *(uint *)(local_48 + 0x20);
    *(uint *)(local_48 + 0x20) = uVar2 + 1;
    *(ulong *)(*(long *)(local_48 + 0x30) + (ulong)uVar2 * 8) = local_80;
    local_31 = structural_or_whitespace[*local_58] != 0;
  }
  else {
    local_68 = (uint64_t)(byte)(*local_58 - 0x30);
    do {
      local_58 = local_58 + 1;
      bVar3 = is_integer(*local_58);
      if (!bVar3) goto LAB_0011e94b;
      bVar1 = *local_58;
      bVar3 = mul_overflow(local_68,10,&local_68);
      if (bVar3) {
        return false;
      }
      bVar3 = add_overflow(local_68,(ulong)(byte)(bVar1 - 0x30),&local_68);
    } while (!bVar3);
    local_31 = false;
  }
  return local_31;
}

Assistant:

static never_inline bool parse_large_integer(const uint8_t *const buf,
                                             ParsedJson &pj,
                                             const uint32_t offset,
                                             bool found_minus) {
  const char *p = reinterpret_cast<const char *>(buf + offset);

  bool negative = false;
  if (found_minus) {
    ++p;
    negative = true;
  }
  uint64_t i;
  if (*p == '0') { // 0 cannot be followed by an integer
    ++p;
    i = 0;
  } else {
    unsigned char digit = *p - '0';
    i = digit;
    p++;
    // the is_made_of_eight_digits_fast routine is unlikely to help here because
    // we rarely see large integer parts like 123456789
    while (is_integer(*p)) {
      digit = *p - '0';
      if (mul_overflow(i, 10, &i)) {
#ifdef JSON_TEST_NUMBERS // for unit testing
        foundInvalidNumber(buf + offset);
#endif
        return false; // overflow
      }
      if (add_overflow(i, digit, &i)) {
#ifdef JSON_TEST_NUMBERS // for unit testing
        foundInvalidNumber(buf + offset);
#endif
        return false; // overflow
      }
      ++p;
    }
  }
  if (negative) {
    if (i > 0x8000000000000000) {
// overflows!
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false; // overflow
    }
  } else {
    if (i >= 0x8000000000000000) {
// overflows!
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false; // overflow
    }
  }
  int64_t signed_answer = negative ? -i : i;
  pj.write_tape_s64(signed_answer);
#ifdef JSON_TEST_NUMBERS // for unit testing
  foundInteger(signed_answer, buf + offset);
#endif
  return is_structural_or_whitespace(*p);
}